

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

string * CLI::AsNumberWithUnit::generate_description<int>
                   (string *__return_storage_ptr__,string *name,Options opts)

{
  char *pcVar1;
  ostream *poVar2;
  stringstream local_1a8 [8];
  stringstream out;
  ostream local_198 [383];
  Options local_19;
  string *psStack_18;
  Options opts_local;
  string *name_local;
  
  local_19 = opts;
  psStack_18 = name;
  name_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  pcVar1 = detail::type_name<int,_(CLI::detail::enabler)0>();
  poVar2 = std::operator<<(local_198,pcVar1);
  std::operator<<(poVar2,' ');
  if ((local_19 & UNIT_REQUIRED) == CASE_SENSITIVE) {
    poVar2 = std::operator<<(local_198,'[');
    poVar2 = std::operator<<(poVar2,(string *)psStack_18);
    std::operator<<(poVar2,']');
  }
  else {
    std::operator<<(local_198,(string *)psStack_18);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string generate_description(const std::string &name, Options opts) {
        std::stringstream out;
        out << detail::type_name<Number>() << ' ';
        if(opts & UNIT_REQUIRED) {
            out << name;
        } else {
            out << '[' << name << ']';
        }
        return out.str();
    }